

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O1

void __thiscall
cmTargetLinkLibrariesCommand::LinkLibraryTypeSpecifierWarning
          (cmTargetLinkLibrariesCommand *this,int left,int right)

{
  char *pcVar1;
  cmMakefile *this_00;
  size_t sVar2;
  ostringstream w;
  string local_1b8;
  undefined1 local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Link library type specifier \"",0x1d);
  pcVar1 = LinkLibraryTypeNames[left];
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)&local_1b8 + (int)*(_func_int **)(local_198._0_8_ + -0x18) + 0x20);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"\" is followed by specifier \"",0x1c);
  pcVar1 = LinkLibraryTypeNames[right];
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)&local_1b8 + (int)*(_func_int **)(local_198._0_8_ + -0x18) + 0x20);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"\" instead of a library name.  ",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"The first specifier will be ignored.",0x24);
  this_00 = (this->super_cmCommand).Makefile;
  std::__cxx11::stringbuf::str();
  cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  return;
}

Assistant:

void cmTargetLinkLibrariesCommand::LinkLibraryTypeSpecifierWarning(int left,
                                                                   int right)
{
  std::ostringstream w;
  w << "Link library type specifier \""
    << cmTargetLinkLibrariesCommand::LinkLibraryTypeNames[left]
    << "\" is followed by specifier \""
    << cmTargetLinkLibrariesCommand::LinkLibraryTypeNames[right]
    << "\" instead of a library name.  "
    << "The first specifier will be ignored.";
  this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
}